

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_faceid_spacing
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT faceid,REF_DBL set_normal_spacing,
          REF_DBL ceil_normal_spacing,REF_DBL tangential_aspect_ratio)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_INT *vector;
  REF_DBL *vector_00;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_DBL h;
  REF_DBL logm [6];
  REF_DBL m [6];
  REF_DBL d [12];
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_node;
  REF_DBL normal [3];
  int local_e8;
  int local_e4;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT i;
  REF_INT node;
  REF_INT *hits;
  REF_DBL *new_log_metric;
  REF_INT nodes [27];
  int local_54;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL tangential_aspect_ratio_local;
  REF_DBL ceil_normal_spacing_local;
  REF_DBL set_normal_spacing_local;
  REF_INT faceid_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x92c,
           "ref_metric_faceid_spacing","malloc hits of REF_INT negative");
    metric_local._4_4_ = 1;
  }
  else {
    vector = (REF_INT *)malloc((long)ref_node_00->max << 2);
    if (vector == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x92c,"ref_metric_faceid_spacing","malloc hits of REF_INT NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (local_e4 = 0; local_e4 < ref_node_00->max; local_e4 = local_e4 + 1) {
        vector[local_e4] = 0;
      }
      if (ref_node_00->max * 6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x92d,"ref_metric_faceid_spacing","malloc new_log_metric of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        vector_00 = (REF_DBL *)malloc((long)(ref_node_00->max * 6) << 3);
        if (vector_00 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x92d,"ref_metric_faceid_spacing","malloc new_log_metric of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (local_e8 = 0;
              SBORROW4(local_e8,ref_node_00->max * 6) != local_e8 + ref_node_00->max * -6 < 0;
              local_e8 = local_e8 + 1) {
            vector_00[local_e8] = 0.0;
          }
          for (local_54 = 0; local_54 < ref_cell_00->max; local_54 = local_54 + 1) {
            RVar1 = ref_cell_nodes(ref_cell_00,local_54,(REF_INT *)&new_log_metric);
            if ((RVar1 == 0) && (faceid == nodes[(long)ref_cell_00->node_per + -2])) {
              uVar2 = ref_node_tri_normal(ref_node_00,(REF_INT *)&new_log_metric,
                                          (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x932,"ref_metric_faceid_spacing",(ulong)uVar2,"normal area");
                return uVar2;
              }
              uVar2 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x933,"ref_metric_faceid_spacing",(ulong)uVar2,"normalize");
                return uVar2;
              }
              for (ref_private_macro_code_rss_1 = 0;
                  ref_private_macro_code_rss_1 < ref_cell_00->node_per;
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                iVar4 = nodes[(long)ref_private_macro_code_rss_1 + -2];
                ref_private_macro_code_rss_4 =
                     ref_metric_closest_d
                               ((REF_DBL *)&ref_private_macro_code_rss,metric + iVar4 * 6,m + 5);
                if (ref_private_macro_code_rss_4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x938,"ref_metric_faceid_spacing",
                         (ulong)(uint)ref_private_macro_code_rss_4,"closest");
                  return ref_private_macro_code_rss_4;
                }
                if (0.0 < set_normal_spacing) {
                  if (set_normal_spacing * 1e+20 * set_normal_spacing <= 0.0) {
                    local_228 = -(set_normal_spacing * 1e+20 * set_normal_spacing);
                  }
                  else {
                    local_228 = set_normal_spacing * 1e+20 * set_normal_spacing;
                  }
                  _ref_private_macro_code_rss_3 = set_normal_spacing;
                  if (local_228 <= 1.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x93b,"ref_metric_faceid_spacing","eig 0");
                    return 1;
                  }
                  m[5] = 1.0 / (set_normal_spacing * set_normal_spacing);
                }
                if (0.0 < ceil_normal_spacing) {
                  dVar6 = sqrt(m[5]);
                  if (dVar6 * 1e+20 <= 0.0) {
                    dVar6 = sqrt(m[5]);
                    local_230 = -(dVar6 * 1e+20);
                  }
                  else {
                    local_230 = sqrt(m[5]);
                    local_230 = local_230 * 1e+20;
                  }
                  if (local_230 <= 1.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x93f,"ref_metric_faceid_spacing","eig 0");
                    return 1;
                  }
                  dVar6 = sqrt(m[5]);
                  local_238 = ceil_normal_spacing;
                  if (1.0 / dVar6 < ceil_normal_spacing) {
                    local_238 = 1.0 / dVar6;
                  }
                  _ref_private_macro_code_rss_3 = local_238;
                  if (local_238 * 1e+20 * local_238 <= 0.0) {
                    local_240 = -(local_238 * 1e+20 * local_238);
                  }
                  else {
                    local_240 = local_238 * 1e+20 * local_238;
                  }
                  if (local_240 <= 1.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x942,"ref_metric_faceid_spacing","eig 0");
                    return 1;
                  }
                  m[5] = 1.0 / (local_238 * local_238);
                }
                if (1.0 < tangential_aspect_ratio) {
                  if (d[1] <= d[0] * tangential_aspect_ratio * tangential_aspect_ratio) {
                    local_248 = d[0] * tangential_aspect_ratio * tangential_aspect_ratio;
                  }
                  else {
                    local_248 = d[1];
                  }
                  d[1] = local_248;
                }
                ref_private_macro_code_rss_5 = ref_matrix_form_m(m + 5,logm + 5);
                if (ref_private_macro_code_rss_5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x94b,"ref_metric_faceid_spacing",
                         (ulong)(uint)ref_private_macro_code_rss_5,"form");
                  return ref_private_macro_code_rss_5;
                }
                ref_private_macro_code_rss_6 = ref_matrix_log_m(logm + 5,&h);
                if (ref_private_macro_code_rss_6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x94c,"ref_metric_faceid_spacing",
                         (ulong)(uint)ref_private_macro_code_rss_6,"form");
                  return ref_private_macro_code_rss_6;
                }
                for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                  iVar3 = ref_malloc_init_i_1 + iVar4 * 6;
                  vector_00[iVar3] = logm[(long)ref_malloc_init_i_1 + -1] + vector_00[iVar3];
                }
                vector[iVar4] = vector[iVar4] + 1;
                ref_private_macro_code_rss_6 = 0;
              }
            }
          }
          ref_private_macro_code_rss_7 = ref_node_ghost_dbl(ref_node_00,vector_00,6);
          if (ref_private_macro_code_rss_7 == 0) {
            ref_edge._4_4_ = ref_node_ghost_int(ref_node_00,vector,1);
            if (ref_edge._4_4_ == 0) {
              ref_edge._4_4_ = 0;
              for (ref_malloc_init_i = 0; ref_malloc_init_i < ref_node_00->max;
                  ref_malloc_init_i = ref_malloc_init_i + 1) {
                if ((((-1 < ref_malloc_init_i) && (ref_malloc_init_i < ref_node_00->max)) &&
                    (-1 < ref_node_00->global[ref_malloc_init_i])) &&
                   (0 < vector[ref_malloc_init_i])) {
                  for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                      ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                    iVar4 = ref_malloc_init_i_1 + ref_malloc_init_i * 6;
                    vector_00[iVar4] = vector_00[iVar4] / (double)vector[ref_malloc_init_i];
                  }
                  vector[ref_malloc_init_i] = -1;
                  ref_edge._0_4_ =
                       ref_matrix_exp_m(vector_00 + ref_malloc_init_i * 6,
                                        metric + ref_malloc_init_i * 6);
                  if ((uint)ref_edge != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x95f,"ref_metric_faceid_spacing",(ulong)(uint)ref_edge,"form");
                    return (uint)ref_edge;
                  }
                  ref_edge._0_4_ = 0;
                }
              }
              metric_local._4_4_ = ref_edge_create((REF_EDGE *)&node0,ref_grid);
              if (metric_local._4_4_ == 0) {
                for (node1 = 0; node1 < _node0->n; node1 = node1 + 1) {
                  iVar4 = _node0->e2n[node1 << 1];
                  iVar3 = _node0->e2n[node1 * 2 + 1];
                  if ((-1 < vector[iVar4]) && (vector[iVar3] == -1)) {
                    for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                        ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                      iVar5 = ref_malloc_init_i_1 + iVar4 * 6;
                      vector_00[iVar5] =
                           vector_00[ref_malloc_init_i_1 + iVar3 * 6] + vector_00[iVar5];
                    }
                    vector[iVar4] = vector[iVar4] + 1;
                  }
                  if ((-1 < vector[iVar3]) && (vector[iVar4] == -1)) {
                    for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                        ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                      iVar5 = ref_malloc_init_i_1 + iVar3 * 6;
                      vector_00[iVar5] =
                           vector_00[ref_malloc_init_i_1 + iVar4 * 6] + vector_00[iVar5];
                    }
                    vector[iVar3] = vector[iVar3] + 1;
                  }
                }
                ref_edge_free(_node0);
                metric_local._4_4_ = ref_node_ghost_dbl(ref_node_00,vector_00,6);
                if (metric_local._4_4_ == 0) {
                  metric_local._4_4_ = ref_node_ghost_int(ref_node_00,vector,1);
                  if (metric_local._4_4_ == 0) {
                    for (ref_malloc_init_i = 0; ref_malloc_init_i < ref_node_00->max;
                        ref_malloc_init_i = ref_malloc_init_i + 1) {
                      if ((((-1 < ref_malloc_init_i) && (ref_malloc_init_i < ref_node_00->max)) &&
                          (-1 < ref_node_00->global[ref_malloc_init_i])) &&
                         (0 < vector[ref_malloc_init_i])) {
                        for (ref_malloc_init_i_1 = 0; ref_malloc_init_i_1 < 6;
                            ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1) {
                          iVar4 = ref_malloc_init_i_1 + ref_malloc_init_i * 6;
                          vector_00[iVar4] = vector_00[iVar4] / (double)vector[ref_malloc_init_i];
                        }
                        vector[ref_malloc_init_i] = -2;
                        uVar2 = ref_matrix_exp_m(vector_00 + ref_malloc_init_i * 6,
                                                 metric + ref_malloc_init_i * 6);
                        if (uVar2 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0x984,"ref_metric_faceid_spacing",(ulong)uVar2,"form");
                          return uVar2;
                        }
                      }
                    }
                    metric_local._4_4_ = ref_node_ghost_dbl(ref_node_00,metric,6);
                    if (metric_local._4_4_ == 0) {
                      if (vector_00 != (REF_DBL *)0x0) {
                        free(vector_00);
                      }
                      if (vector != (REF_INT *)0x0) {
                        free(vector);
                      }
                      metric_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x988,"ref_metric_faceid_spacing",(ulong)metric_local._4_4_,
                             "ghost metric");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x97b,"ref_metric_faceid_spacing",(ulong)metric_local._4_4_,"ghost hits"
                          );
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x97a,"ref_metric_faceid_spacing",(ulong)metric_local._4_4_,"ghost metric"
                        );
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x966,"ref_metric_faceid_spacing",(ulong)metric_local._4_4_,"orig edges");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x956,"ref_metric_faceid_spacing",(ulong)ref_edge._4_4_,"ghost hits");
              metric_local._4_4_ = ref_edge._4_4_;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x955,"ref_metric_faceid_spacing",(ulong)(uint)ref_private_macro_code_rss_7,
                   "ghost metric");
            metric_local._4_4_ = ref_private_macro_code_rss_7;
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_faceid_spacing(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_INT faceid,
                                             REF_DBL set_normal_spacing,
                                             REF_DBL ceil_normal_spacing,
                                             REF_DBL tangential_aspect_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *new_log_metric;
  REF_INT *hits;
  REF_INT node;
  REF_INT i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (faceid == nodes[ref_cell_id_index(ref_cell)]) {
      REF_DBL normal[3];
      REF_INT cell_node;
      RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal area");
      RSS(ref_math_normalize(normal), "normalize");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        REF_DBL d[12], m[6], logm[6];
        REF_DBL h;
        node = nodes[cell_node];
        RSS(ref_metric_closest_d(normal, &(metric[6 * node]), d), "closest");
        if (set_normal_spacing > 0.0) {
          h = set_normal_spacing;
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (ceil_normal_spacing > 0.0) {
          RAS(ref_math_divisible(1.0, sqrt(ref_matrix_eig(d, 0))), "eig 0");
          h = 1.0 / sqrt(ref_matrix_eig(d, 0));
          h = MIN(h, ceil_normal_spacing);
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (tangential_aspect_ratio > 1.0) {
          ref_matrix_eig(d, 2) =
              MAX(ref_matrix_eig(d, 2), ref_matrix_eig(d, 1) *
                                            tangential_aspect_ratio *
                                            tangential_aspect_ratio);
        }
        RSS(ref_matrix_form_m(d, m), "form");
        RSS(ref_matrix_log_m(m, logm), "form");
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node] += logm[i];
        }
        hits[node] += 1;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}